

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O2

char * __thiscall cmTest::GetProperty(cmTest *this,string *prop)

{
  bool bVar1;
  char *pcVar2;
  cmState *this_00;
  
  pcVar2 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (pcVar2 == (char *)0x0) {
    this_00 = cmMakefile::GetState(this->Makefile);
    bVar1 = cmState::IsPropertyChained(this_00,prop,TEST);
    if (bVar1) {
      pcVar2 = cmMakefile::GetProperty(this->Makefile,prop,true);
      return pcVar2;
    }
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char *cmTest::GetProperty(const std::string& prop) const
{
  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->Makefile->GetState()->
          IsPropertyChained(prop, cmProperty::TEST);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}